

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_value.hpp
# Opt level: O2

void __thiscall
chaiscript::Boxed_Value::
Boxed_Value<std::vector<Utility_Test_Numbers,std::allocator<Utility_Test_Numbers>>,void>
          (Boxed_Value *this,vector<Utility_Test_Numbers,_std::allocator<Utility_Test_Numbers>_> *t,
          bool t_return_value)

{
  _Vector_base<Utility_Test_Numbers,_std::allocator<Utility_Test_Numbers>_> local_28;
  
  local_28._M_impl.super__Vector_impl_data._M_start =
       (t->super__Vector_base<Utility_Test_Numbers,_std::allocator<Utility_Test_Numbers>_>)._M_impl.
       super__Vector_impl_data._M_start;
  local_28._M_impl.super__Vector_impl_data._M_finish =
       (t->super__Vector_base<Utility_Test_Numbers,_std::allocator<Utility_Test_Numbers>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  local_28._M_impl.super__Vector_impl_data._M_end_of_storage =
       (t->super__Vector_base<Utility_Test_Numbers,_std::allocator<Utility_Test_Numbers>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (t->super__Vector_base<Utility_Test_Numbers,_std::allocator<Utility_Test_Numbers>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (t->super__Vector_base<Utility_Test_Numbers,_std::allocator<Utility_Test_Numbers>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (t->super__Vector_base<Utility_Test_Numbers,_std::allocator<Utility_Test_Numbers>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Object_Data::get<std::vector<Utility_Test_Numbers,std::allocator<Utility_Test_Numbers>>>
            ((vector<Utility_Test_Numbers,_std::allocator<Utility_Test_Numbers>_> *)this,
             SUB81(&local_28,0));
  Catch::clara::std::_Vector_base<Utility_Test_Numbers,_std::allocator<Utility_Test_Numbers>_>::
  ~_Vector_base(&local_28);
  return;
}

Assistant:

static auto get(std::reference_wrapper<T> obj, bool t_return_value) {
        auto p = &obj.get();
        return std::make_shared<Data>(detail::Get_Type_Info<T>::get(), chaiscript::detail::Any(std::move(obj)), true, p, t_return_value);
      }